

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3rbu * sqlite3rbu_vacuum(char *zTarget,char *zState)

{
  size_t sVar1;
  ulong uVar2;
  sqlite3rbu *psVar3;
  
  if (zTarget == (char *)0x0) {
LAB_00144f25:
    psVar3 = rbuMisuseError();
    return psVar3;
  }
  if (zState == (char *)0x0) {
    zState = (char *)0x0;
  }
  else {
    sVar1 = strlen(zState);
    if ((6 < (int)sVar1) &&
       (uVar2 = (ulong)((int)sVar1 - 7),
       *(int *)(zState + uVar2 + 3) == 0x706d7463 && *(int *)(zState + uVar2) == 0x6361762d))
    goto LAB_00144f25;
  }
  psVar3 = openRbuHandle((char *)0x0,zTarget,zState);
  return psVar3;
}

Assistant:

SQLITE_API sqlite3rbu *sqlite3rbu_vacuum(
  const char *zTarget, 
  const char *zState
){
  if( zTarget==0 ){ return rbuMisuseError(); }
  if( zState ){
    int n = strlen(zState);
    if( n>=7 && 0==memcmp("-vactmp", &zState[n-7], 7) ){
      return rbuMisuseError();
    }
  }
  /* TODO: Check that both arguments are non-NULL */
  return openRbuHandle(0, zTarget, zState);
}